

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.cpp
# Opt level: O3

void __thiscall
duckdb::roaring::BitsetContainerScanState::ScanPartial
          (BitsetContainerScanState *this,Vector *result,idx_t result_offset,idx_t to_scan)

{
  idx_t *piVar1;
  idx_t input_start;
  
  input_start = (this->super_ContainerScanState).scanned_count;
  if ((input_start & 0x3f) == 0 && ((to_scan & 0x3f) == 0 && result_offset == 0)) {
    ValidityUncompressed::AlignedScan((data_ptr_t)this->bitset,input_start,result,to_scan);
  }
  else {
    ValidityUncompressed::UnalignedScan
              ((data_ptr_t)this->bitset,(this->super_ContainerScanState).container_size,input_start,
               result,result_offset,to_scan);
  }
  piVar1 = &(this->super_ContainerScanState).scanned_count;
  *piVar1 = *piVar1 + to_scan;
  return;
}

Assistant:

void BitsetContainerScanState::ScanPartial(Vector &result, idx_t result_offset, idx_t to_scan) {
	if (!result_offset && (to_scan % ValidityMask::BITS_PER_VALUE) == 0 &&
	    (scanned_count % ValidityMask::BITS_PER_VALUE) == 0) {
		ValidityUncompressed::AlignedScan(reinterpret_cast<data_ptr_t>(bitset), scanned_count, result, to_scan);
	} else {
		ValidityUncompressed::UnalignedScan(reinterpret_cast<data_ptr_t>(bitset), container_size, scanned_count, result,
		                                    result_offset, to_scan);
	}
	scanned_count += to_scan;
}